

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  undefined4 extraout_EAX;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  secp256k1_scalar *psVar14;
  secp256k1_modinv64_signed62 *x;
  ulong uVar15;
  secp256k1_scalar *psVar16;
  uint64_t uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  secp256k1_modinv64_signed62 sStack_80;
  secp256k1_scalar *psStack_58;
  
  secp256k1_scalar_verify(a);
  psVar16 = b;
  secp256k1_scalar_verify(b);
  uVar1 = b->d[0];
  uVar3 = a->d[0];
  uVar8 = uVar1 + a->d[0];
  r->d[0] = uVar8;
  uVar1 = (ulong)CARRY8(uVar1,uVar3);
  uVar3 = a->d[1] + uVar1;
  uVar11 = (ulong)CARRY8(a->d[1],uVar1);
  uVar1 = b->d[1];
  uVar4 = uVar3 + b->d[1];
  r->d[1] = uVar4;
  uVar1 = (ulong)CARRY8(uVar3,uVar1);
  uVar3 = uVar11 + a->d[2];
  uVar10 = uVar3 + uVar1;
  uVar15 = (ulong)(CARRY8(uVar11,a->d[2]) || CARRY8(uVar3,uVar1));
  uVar1 = b->d[2];
  uVar11 = uVar10 + b->d[2];
  r->d[2] = uVar11;
  uVar1 = (ulong)CARRY8(uVar10,uVar1);
  uVar3 = uVar15 + a->d[3];
  bVar22 = CARRY8(uVar15,a->d[3]) || CARRY8(uVar3,uVar1);
  uVar3 = uVar3 + uVar1;
  psVar16 = (secp256k1_scalar *)CONCAT71((int7)((ulong)psVar16 >> 8),bVar22);
  uVar1 = b->d[3];
  uVar18 = (uint)((0xbaaedce6af48a03a < uVar4 && 0xfffffffffffffffd < uVar11) &&
                 uVar3 + uVar1 == 0xffffffffffffffff);
  uVar12 = 0;
  if (0xbaaedce6af48a03b < uVar4) {
    uVar12 = uVar18;
  }
  uVar20 = 0;
  if (0xbfd25e8cd0364140 < uVar8) {
    uVar20 = uVar18;
  }
  psVar14 = (secp256k1_scalar *)(uVar3 + uVar1);
  r->d[3] = (uint64_t)psVar14;
  uVar12 = (uint)bVar22 + (uVar20 | uVar12 | (uVar3 + uVar1 & uVar11) == 0xffffffffffffffff) +
           (uint)CARRY8(uVar3,uVar1);
  if (1 < uVar12) {
    secp256k1_scalar_add_cold_1();
    psStack_58 = r;
    secp256k1_scalar_verify(psVar14);
    uVar10 = psVar14->d[2] | psVar14->d[0];
    uVar15 = psVar14->d[3] | psVar14->d[1];
    secp256k1_scalar_verify(psVar14);
    uVar1 = psVar14->d[0];
    uVar3 = psVar14->d[1];
    uVar4 = psVar14->d[2];
    uVar8 = psVar14->d[3];
    secp256k1_scalar_verify(psVar14);
    uVar6 = 0xffffffff;
    uVar11 = uVar1 & 0x3fffffffffffffff;
    x = &sStack_80;
    sStack_80.v[1] = (uVar3 & 0xfffffffffffffff) << 2 | uVar1 >> 0x3e;
    sStack_80.v[2] = (uVar4 & 0x3ffffffffffffff) << 4 | uVar3 >> 0x3c;
    sStack_80.v[3] = (uVar8 & 0xffffffffffffff) << 6 | uVar4 >> 0x3a;
    sStack_80.v[4] = uVar8 >> 0x38;
    sStack_80.v[0] = uVar11;
    secp256k1_modinv64(x,&secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(psVar16,x);
    iVar13 = (int)x;
    secp256k1_scalar_verify(psVar16);
    psVar14 = psVar16;
    secp256k1_scalar_verify(psVar16);
    auVar24._0_4_ = -(uint)((int)psVar16->d[2] == 0 && (int)psVar16->d[0] == 0);
    auVar24._4_4_ =
         -(uint)(*(int *)((long)psVar16->d + 0x14) == 0 && *(int *)((long)psVar16->d + 4) == 0);
    auVar24._8_4_ = -(uint)((int)psVar16->d[3] == 0 && (int)psVar16->d[1] == 0);
    auVar24._12_4_ =
         -(uint)(*(int *)((long)psVar16->d + 0x1c) == 0 && *(int *)((long)psVar16->d + 0xc) == 0);
    iVar2 = movmskps(extraout_EAX,auVar24);
    iStack_90 = (int)uVar10;
    iStack_8c = (int)(uVar10 >> 0x20);
    iStack_88 = (int)uVar15;
    iStack_84 = (int)(uVar15 >> 0x20);
    auVar25._0_4_ = -(uint)(iStack_90 == 0);
    auVar25._4_4_ = -(uint)(iStack_8c == 0);
    auVar25._8_4_ = -(uint)(iStack_88 == 0);
    auVar25._12_4_ = -(uint)(iStack_84 == 0);
    iVar7 = movmskps(uVar6,auVar25);
    if ((iVar7 != 0xf) == (iVar2 == 0xf)) {
      secp256k1_scalar_inverse_cold_1();
      lVar21 = (long)iVar13;
      secp256k1_scalar_verify(psVar14);
      auVar23._0_4_ = -(uint)((int)psVar14->d[2] == 0 && (int)psVar14->d[0] == 0);
      auVar23._4_4_ =
           -(uint)(*(int *)((long)psVar14->d + 0x14) == 0 && *(int *)((long)psVar14->d + 4) == 0);
      auVar23._8_4_ = -(uint)((int)psVar14->d[3] == 0 && (int)psVar14->d[1] == 0);
      auVar23._12_4_ =
           -(uint)(*(int *)((long)psVar14->d + 0x1c) == 0 && *(int *)((long)psVar14->d + 0xc) == 0);
      iVar2 = movmskps((int)uVar11,auVar23);
      secp256k1_scalar_verify(psVar14);
      uVar9 = 0;
      uVar10 = -lVar21;
      uVar15 = psVar14->d[0] ^ uVar10;
      uVar4 = psVar14->d[1] ^ uVar10;
      uVar19 = psVar14->d[2] ^ uVar10;
      uVar1 = psVar14->d[3];
      uVar3 = (ulong)CARRY8(uVar10 & 0xbfd25e8cd0364142,uVar15);
      uVar8 = (uVar10 & 0xbaaedce6af48a03b) + uVar4;
      uVar4 = (ulong)(CARRY8(uVar10 & 0xbaaedce6af48a03b,uVar4) || CARRY8(uVar8,uVar3));
      uVar11 = (uVar10 & 0xfffffffffffffffe) + uVar19;
      bVar22 = iVar2 == 0xf;
      uVar17 = uVar8 + uVar3;
      uVar5 = (uVar10 & 0xbfd25e8cd0364142) + uVar15;
      if (bVar22) {
        uVar17 = uVar9;
        uVar5 = uVar9;
      }
      psVar14->d[0] = uVar5;
      psVar14->d[1] = uVar17;
      uVar5 = uVar11 + uVar4;
      if (bVar22) {
        uVar5 = uVar9;
      }
      psVar14->d[2] = uVar5;
      uVar5 = ((uVar10 ^ uVar1) - lVar21) +
              (ulong)(CARRY8(uVar10 & 0xfffffffffffffffe,uVar19) || CARRY8(uVar11,uVar4));
      if (bVar22) {
        uVar5 = uVar9;
      }
      psVar14->d[3] = uVar5;
      secp256k1_scalar_verify(psVar14);
      return -(uint)(lVar21 != 0) | 1;
    }
    return CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0xf);
  }
  uVar10 = (ulong)uVar12;
  uVar1 = (ulong)CARRY8(uVar10 * 0x402da1732fc9bebf,uVar8);
  uVar3 = uVar4 + uVar10 * 0x4551231950b75fc4;
  r->d[0] = uVar10 * 0x402da1732fc9bebf + uVar8;
  r->d[1] = uVar3 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar4,uVar10 * 0x4551231950b75fc4) || CARRY8(uVar3,uVar1));
  r->d[2] = uVar11 + uVar10 + uVar1;
  r->d[3] = (long)psVar14->d + (ulong)(CARRY8(uVar11,uVar10) || CARRY8(uVar11 + uVar10,uVar1));
  secp256k1_scalar_verify(r);
  secp256k1_scalar_verify(r);
  return uVar12;
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_u128_from_u64(&t, a->d[0]);
    secp256k1_u128_accum_u64(&t, b->d[0]);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[1]);
    secp256k1_u128_accum_u64(&t, b->d[1]);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[2]);
    secp256k1_u128_accum_u64(&t, b->d[2]);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[3]);
    secp256k1_u128_accum_u64(&t, b->d[3]);
    r->d[3] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    overflow = secp256k1_u128_to_u64(&t) + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);

    SECP256K1_SCALAR_VERIFY(r);
    return overflow;
}